

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

ostream * doctest::detail::getTlsOss(void)

{
  ostream *poVar1;
  long lVar2;
  long *in_FS_OFFSET;
  allocator local_39;
  string local_38 [32];
  
  g_infoContexts::__tls_init();
  lVar2 = *in_FS_OFFSET;
  poVar1 = (ostream *)(lVar2 + -0x1b0);
  std::ios::clear((int)*(undefined8 *)(in_FS_OFFSET[-0x36] + -0x18) + (int)poVar1);
  g_infoContexts::__tls_init();
  std::__cxx11::string::string(local_38,"",&local_39);
  std::__cxx11::stringbuf::str((string *)(lVar2 + -0x1a8));
  std::__cxx11::string::~string(local_38);
  g_infoContexts::__tls_init();
  return poVar1;
}

Assistant:

std::ostream* getTlsOss() {
        g_oss.clear(); // there shouldn't be anything worth clearing in the flags
        g_oss.str(""); // the slow way of resetting a string stream
        //g_oss.seekp(0); // optimal reset - as seen here: https://stackoverflow.com/a/624291/3162383
        return &g_oss;
    }